

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  const_iterator end_00;
  long lVar1;
  const_iterator pRVar2;
  WordRange wr;
  value_type local_40;
  
  do {
    lVar1 = 0;
    while( true ) {
      end_00 = (const_iterator)((long)&begin->rune + lVar1);
      if (end_00 == end) {
        if (begin != end) {
          InternalCut(this,begin,end_00,res);
        }
        return;
      }
      if (end_00->rune < 0x80) break;
      lVar1 = lVar1 + 0x14;
    }
    if (lVar1 != 0) {
      InternalCut(this,begin,end_00,res);
    }
    begin = SequentialLetterRule(this,end_00,end);
    if (end_00 == begin) {
      pRVar2 = NumbersRule(this,end_00,end);
      begin = pRVar2 + 1;
      if (end_00 != pRVar2) {
        begin = pRVar2;
      }
    }
    local_40.right = begin + -1;
    local_40.left = end_00;
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(res,&local_40)
    ;
  } while( true );
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right = begin;
    while (right != end) {
      if (right->rune < 0x80) {
        if (left != right) {
          InternalCut(left, right, res);
        }
        left = right;
        do {
          right = SequentialLetterRule(left, end);
          if (right != left) {
            break;
          }
          right = NumbersRule(left, end);
          if (right != left) {
            break;
          }
          right ++;
        } while (false);
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      } else {
        right++;
      }
    }
    if (left != right) {
      InternalCut(left, right, res);
    }
  }